

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void encode_message(upb_encstate *e,upb_Message *msg,upb_MiniTable *m,size_t *size)

{
  upb_MiniTableField *puVar1;
  _Bool _Var2;
  int iVar3;
  upb_Extension *puVar4;
  upb_MiniTableField *first;
  upb_MiniTableField *f;
  upb_Extension *end;
  _upb_sortedmap sorted;
  upb_Extension *ext;
  size_t ext_count;
  char *unknown;
  size_t unknown_size;
  size_t pre_len;
  size_t *size_local;
  upb_MiniTable *m_local;
  upb_Message *msg_local;
  upb_encstate *e_local;
  
  unknown_size = (long)e->limit - (long)e->ptr;
  pre_len = (size_t)size;
  size_local = (size_t *)m;
  m_local = (upb_MiniTable *)msg;
  msg_local = (upb_Message *)e;
  if ((((e->options & 4U) != 0) && (m->required_count_dont_copy_me__upb_internal_use_only != '\0'))
     && (_Var2 = _upb_Message_IsInitializedShallow_dont_copy_me__upb_internal_use_only(msg,m),
        !_Var2)) {
    encode_err((upb_encstate *)msg_local,kUpb_EncodeStatus_MissingRequired);
  }
  if ((((ulong)msg_local[0x1e].field_0 & 2) == 0) &&
     (ext_count = (size_t)upb_Message_GetUnknown((upb_Message *)m_local,(size_t *)&unknown),
     (char *)ext_count != (char *)0x0)) {
    encode_bytes((upb_encstate *)msg_local,(void *)ext_count,(size_t)unknown);
  }
  if ((*(char *)((long)size_local + 0x14) != '\0') &&
     (sorted._4_8_ = _upb_Message_Getexts_dont_copy_me__upb_internal_use_only
                               ((upb_Message *)m_local,(size_t *)&ext), ext != (upb_Extension *)0x0)
     ) {
    if (((ulong)msg_local[0x1e].field_0 & 1) == 0) {
      puVar4 = (upb_Extension *)(sorted._4_8_ + ext * 0x18);
      for (; (upb_Extension *)sorted._4_8_ != puVar4; sorted._4_8_ = sorted._4_8_ + 0x18) {
        encode_ext((upb_encstate *)msg_local,(upb_Extension *)sorted._4_8_,
                   *(char *)((long)size_local + 0x14) == '\x02');
      }
    }
    else {
      _upb_mapsorter_pushexts
                ((_upb_mapsorter *)(msg_local + 0x1f),(upb_Extension *)sorted._4_8_,(size_t)ext,
                 (_upb_sortedmap *)((long)&end + 4));
      while (_Var2 = _upb_sortedmap_nextext
                               ((_upb_mapsorter *)(msg_local + 0x1f),
                                (_upb_sortedmap *)((long)&end + 4),(upb_Extension **)&sorted.pos),
            _Var2) {
        encode_ext((upb_encstate *)msg_local,(upb_Extension *)sorted._4_8_,
                   *(char *)((long)size_local + 0x14) == '\x02');
      }
      _upb_mapsorter_popmap((_upb_mapsorter *)(msg_local + 0x1f),(_upb_sortedmap *)((long)&end + 4))
      ;
    }
  }
  iVar3 = upb_MiniTable_FieldCount((upb_MiniTable *)size_local);
  if (iVar3 != 0) {
    first = (upb_MiniTableField *)
            (size_local[1] + (ulong)*(ushort *)((long)size_local + 0x12) * 0xc);
    puVar1 = (upb_MiniTableField *)size_local[1];
    while (first != puVar1) {
      first = first + -1;
      _Var2 = encode_shouldencode((upb_encstate *)msg_local,(upb_Message *)m_local,first);
      if (_Var2) {
        encode_field((upb_encstate *)msg_local,(upb_Message *)m_local,
                     (upb_MiniTableSubInternal *)*size_local,first);
      }
    }
  }
  *(uintptr_t *)pre_len =
       (msg_local[0x1d].field_0.internal_opaque - msg_local[0x1c].field_0.internal_opaque) -
       unknown_size;
  return;
}

Assistant:

static void encode_message(upb_encstate* e, const upb_Message* msg,
                           const upb_MiniTable* m, size_t* size) {
  size_t pre_len = e->limit - e->ptr;

  if (e->options & kUpb_EncodeOption_CheckRequired) {
    if (m->UPB_PRIVATE(required_count)) {
      if (!UPB_PRIVATE(_upb_Message_IsInitializedShallow)(msg, m)) {
        encode_err(e, kUpb_EncodeStatus_MissingRequired);
      }
    }
  }

  if ((e->options & kUpb_EncodeOption_SkipUnknown) == 0) {
    size_t unknown_size;
    const char* unknown = upb_Message_GetUnknown(msg, &unknown_size);

    if (unknown) {
      encode_bytes(e, unknown, unknown_size);
    }
  }

  if (m->UPB_PRIVATE(ext) != kUpb_ExtMode_NonExtendable) {
    /* Encode all extensions together. Unlike C++, we do not attempt to keep
     * these in field number order relative to normal fields or even to each
     * other. */
    size_t ext_count;
    const upb_Extension* ext =
        UPB_PRIVATE(_upb_Message_Getexts)(msg, &ext_count);
    if (ext_count) {
      if (e->options & kUpb_EncodeOption_Deterministic) {
        _upb_sortedmap sorted;
        _upb_mapsorter_pushexts(&e->sorter, ext, ext_count, &sorted);
        while (_upb_sortedmap_nextext(&e->sorter, &sorted, &ext)) {
          encode_ext(e, ext, m->UPB_PRIVATE(ext) == kUpb_ExtMode_IsMessageSet);
        }
        _upb_mapsorter_popmap(&e->sorter, &sorted);
      } else {
        const upb_Extension* end = ext + ext_count;
        for (; ext != end; ext++) {
          encode_ext(e, ext, m->UPB_PRIVATE(ext) == kUpb_ExtMode_IsMessageSet);
        }
      }
    }
  }

  if (upb_MiniTable_FieldCount(m)) {
    const upb_MiniTableField* f =
        &m->UPB_PRIVATE(fields)[m->UPB_PRIVATE(field_count)];
    const upb_MiniTableField* first = &m->UPB_PRIVATE(fields)[0];
    while (f != first) {
      f--;
      if (encode_shouldencode(e, msg, f)) {
        encode_field(e, msg, m->UPB_PRIVATE(subs), f);
      }
    }
  }

  *size = (e->limit - e->ptr) - pre_len;
}